

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O1

Error __thiscall argstest::FlagBase::GetError(FlagBase *this)

{
  int iVar1;
  Error EVar2;
  undefined4 extraout_var;
  ulong extraout_RDX;
  
  iVar1 = (*(this->super_NamedBase).super_Base._vptr_Base[0x15])();
  EVar2 = Usage;
  if ((CONCAT44(extraout_var,iVar1) <= extraout_RDX) &&
     (EVar2 = Usage,
     (this->matcher).longFlags._M_h._M_element_count != 0 ||
     (this->matcher).shortFlags._M_h._M_element_count != 0)) {
    EVar2 = (this->super_NamedBase).super_Base.error;
  }
  return EVar2;
}

Assistant:

virtual Error GetError() const override
            {
                const auto nargs = NumberOfArguments();
                if (nargs.min > nargs.max)
                {
                    return Error::Usage;
                }

                const auto matcherError = matcher.GetError();
                if (matcherError != Error::None)
                {
                    return matcherError;
                }

                return error;
            }